

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_sessionwidget.cpp
# Opt level: O0

void SessionWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int searchId;
  QModelIndex *pQVar1;
  undefined4 *puVar2;
  code *pcVar3;
  QMetaType QVar4;
  char *__new;
  int *result;
  QMetaType local_4b0 [2];
  QMetaType local_4a0 [2];
  QMetaType local_490 [2];
  QMetaType local_480 [3];
  QMetaType local_468 [2];
  QMetaType local_458 [2];
  QMetaType local_448 [2];
  QMetaType local_438 [2];
  QMetaType local_428 [2];
  QMetaType local_418 [2];
  QMetaType local_408;
  QMetaType local_400;
  QString local_3f8;
  ReplacedParams local_3e0;
  RegExpReplacement local_3c0;
  RegExpPath local_3a0;
  RegExp local_368;
  QString local_320;
  SearchNameHits local_308;
  SearchHits local_2a8;
  QList<QString> local_220;
  QString local_208;
  undefined8 local_1f0;
  quintptr local_1e8;
  QAbstractItemModel *local_1e0;
  uint local_1d8;
  uint local_1d4;
  uint local_1d0;
  undefined1 local_1cc;
  RenameParams local_1c8;
  GetListingParams local_1b0;
  CountFilesParams local_190;
  ReplaceParams local_138;
  SearchParams local_f0;
  QObject *local_28;
  SessionWidget *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (SessionWidget *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    local_28 = _o;
    switch(_id) {
    case 0:
      SearchParams::SearchParams(&local_f0,(SearchParams *)_a[1]);
      search((SessionWidget *)_o,&local_f0);
      SearchParams::~SearchParams(&local_f0);
      break;
    case 1:
      searchMore((SessionWidget *)_o,*_a[1]);
      break;
    case 2:
      collect((SessionWidget *)_o);
      break;
    case 3:
      ReplaceParams::ReplaceParams(&local_138,(ReplaceParams *)_a[1]);
      replace((SessionWidget *)_o,&local_138);
      ReplaceParams::~ReplaceParams(&local_138);
      break;
    case 4:
      CountFilesParams::CountFilesParams(&local_190,(CountFilesParams *)_a[1]);
      countFiles((SessionWidget *)_o,&local_190);
      CountFilesParams::~CountFilesParams(&local_190);
      break;
    case 5:
      canReplace((SessionWidget *)_o,*_a[1]);
      break;
    case 6:
      GetListingParams::GetListingParams(&local_1b0,(GetListingParams *)_a[1]);
      getListing((SessionWidget *)_o,&local_1b0);
      GetListingParams::~GetListingParams(&local_1b0);
      break;
    case 7:
      RenameParams::RenameParams(&local_1c8,(RenameParams *)_a[1]);
      rename((SessionWidget *)_o,(char *)&local_1c8,__new);
      RenameParams::~RenameParams(&local_1c8);
      break;
    case 8:
      local_1cc = (undefined1)*(uint *)((long)_a[1] + 4);
      local_1d8 = *_a[1];
      local_1d4 = CONCAT31(local_1d4._1_3_,local_1cc);
      local_1d0 = local_1d8;
      viewOptionsChanged((SessionWidget *)_o,
                         (ViewOptions)((uint5)local_1d8 | (uint5)local_1d4 << 0x20));
      break;
    case 9:
      onCanceled((SessionWidget *)_o);
      break;
    case 10:
      onCountFiles((SessionWidget *)_o);
      break;
    case 0xb:
      onGetListing((SessionWidget *)_o);
      break;
    case 0xc:
      onFilesCounted((SessionWidget *)_o);
      break;
    case 0xd:
      onRenamed((SessionWidget *)_o,*_a[1],*_a[2]);
      break;
    case 0xe:
      onTabClose((SessionWidget *)_o,*_a[1]);
      break;
    case 0xf:
      pQVar1 = (QModelIndex *)_a[1];
      local_1f0._0_4_ = pQVar1->r;
      local_1f0._4_4_ = pQVar1->c;
      local_1e8 = pQVar1->i;
      local_1e0 = pQVar1->m;
      onCompleterActivated((SessionWidget *)_o,*pQVar1);
      break;
    case 0x10:
      QString::QString(&local_208,(QString *)_a[1]);
      QList<QString>::QList(&local_220,*(QList<QString> **)&_t->field_0x10);
      onListing((SessionWidget *)_o,&local_208,&local_220);
      QList<QString>::~QList(&local_220);
      QString::~QString(&local_208);
      break;
    case 0x11:
      on_results_currentChanged((SessionWidget *)_o,*_a[1]);
      break;
    case 0x12:
      searchId = *_a[1];
      SearchHits::SearchHits(&local_2a8,(SearchHits *)_a[2]);
      SearchNameHits::SearchNameHits(&local_308,*(SearchNameHits **)&_t->field_0x18);
      onFound((SessionWidget *)_o,searchId,&local_2a8,&local_308);
      SearchNameHits::~SearchNameHits(&local_308);
      SearchHits::~SearchHits(&local_2a8);
      break;
    case 0x13:
      onSearch((SessionWidget *)_o);
      break;
    case 0x14:
      QString::QString(&local_320,(QString *)_a[1]);
      onPathChanged((SessionWidget *)_o,&local_320);
      QString::~QString(&local_320);
      break;
    case 0x15:
      onPreview((SessionWidget *)_o);
      break;
    case 0x16:
      onReplace((SessionWidget *)_o);
      break;
    case 0x17:
      RegExp::RegExp(&local_368,(RegExp *)_a[1]);
      onPatternChanged((SessionWidget *)_o,&local_368);
      RegExp::~RegExp(&local_368);
      break;
    case 0x18:
      RegExpPath::RegExpPath(&local_3a0,(RegExpPath *)_a[1]);
      onFilterChanged((SessionWidget *)_o,&local_3a0);
      RegExpPath::~RegExpPath(&local_3a0);
      break;
    case 0x19:
      RegExpReplacement::RegExpReplacement(&local_3c0,(RegExpReplacement *)_a[1]);
      onReplacementChanged((SessionWidget *)_o,&local_3c0);
      RegExpReplacement::~RegExpReplacement(&local_3c0);
      break;
    case 0x1a:
      ReplacedParams::ReplacedParams(&local_3e0,(ReplacedParams *)_a[1]);
      onReplaced((SessionWidget *)_o,&local_3e0);
      ReplacedParams::~ReplacedParams(&local_3e0);
      break;
    case 0x1b:
      onCancel((SessionWidget *)_o);
      break;
    case 0x1c:
      QString::QString(&local_3f8,(QString *)_a[1]);
      on_open_textChanged((SessionWidget *)_o,&local_3f8);
      QString::~QString(&local_3f8);
      break;
    case 0x1d:
      onCacheFileListClicked((SessionWidget *)_o,(bool)(*_a[1] & 1));
    }
  }
  else if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 0:
      if (*_a[1] == 0) {
        QVar4 = QMetaType::fromType<SearchParams>();
        **(undefined8 **)_t = QVar4.d_ptr;
      }
      else {
        memset(&local_408,0,8);
        QMetaType::QMetaType(&local_408);
        **(undefined8 **)_t = local_408.d_ptr;
      }
      break;
    default:
      memset(&local_400,0,8);
      QMetaType::QMetaType(&local_400);
      **(undefined8 **)_t = local_400.d_ptr;
      break;
    case 3:
      if (*_a[1] == 0) {
        QVar4 = QMetaType::fromType<ReplaceParams>();
        **(undefined8 **)_t = QVar4.d_ptr;
      }
      else {
        memset(local_418,0,8);
        QMetaType::QMetaType(local_418);
        **(undefined8 **)_t = local_418[0].d_ptr;
      }
      break;
    case 4:
      if (*_a[1] == 0) {
        QVar4 = QMetaType::fromType<CountFilesParams>();
        **(undefined8 **)_t = QVar4.d_ptr;
      }
      else {
        memset(local_428,0,8);
        QMetaType::QMetaType(local_428);
        **(undefined8 **)_t = local_428[0].d_ptr;
      }
      break;
    case 6:
      if (*_a[1] == 0) {
        QVar4 = QMetaType::fromType<GetListingParams>();
        **(undefined8 **)_t = QVar4.d_ptr;
      }
      else {
        memset(local_438,0,8);
        QMetaType::QMetaType(local_438);
        **(undefined8 **)_t = local_438[0].d_ptr;
      }
      break;
    case 7:
      if (*_a[1] == 0) {
        QVar4 = QMetaType::fromType<RenameParams>();
        **(undefined8 **)_t = QVar4.d_ptr;
      }
      else {
        memset(local_448,0,8);
        QMetaType::QMetaType(local_448);
        **(undefined8 **)_t = local_448[0].d_ptr;
      }
      break;
    case 8:
      if (*_a[1] == 0) {
        QVar4 = QMetaType::fromType<ViewOptions>();
        **(undefined8 **)_t = QVar4.d_ptr;
      }
      else {
        memset(local_458,0,8);
        QMetaType::QMetaType(local_458);
        **(undefined8 **)_t = local_458[0].d_ptr;
      }
      break;
    case 0x12:
      if (*_a[1] == 1) {
        QVar4 = QMetaType::fromType<SearchHits>();
        **(undefined8 **)_t = QVar4.d_ptr;
      }
      else if (*_a[1] == 2) {
        QVar4 = QMetaType::fromType<SearchNameHits>();
        **(undefined8 **)_t = QVar4.d_ptr;
      }
      else {
        memset(local_468,0,8);
        QMetaType::QMetaType(local_468);
        **(undefined8 **)_t = local_468[0].d_ptr;
      }
      break;
    case 0x17:
      if (*_a[1] == 0) {
        QVar4 = QMetaType::fromType<RegExp>();
        **(undefined8 **)_t = QVar4.d_ptr;
      }
      else {
        memset(local_480,0,8);
        QMetaType::QMetaType(local_480);
        **(undefined8 **)_t = local_480[0].d_ptr;
      }
      break;
    case 0x18:
      if (*_a[1] == 0) {
        QVar4 = QMetaType::fromType<RegExpPath>();
        **(undefined8 **)_t = QVar4.d_ptr;
      }
      else {
        memset(local_490,0,8);
        QMetaType::QMetaType(local_490);
        **(undefined8 **)_t = local_490[0].d_ptr;
      }
      break;
    case 0x19:
      if (*_a[1] == 0) {
        QVar4 = QMetaType::fromType<RegExpReplacement>();
        **(undefined8 **)_t = QVar4.d_ptr;
      }
      else {
        memset(local_4a0,0,8);
        QMetaType::QMetaType(local_4a0);
        **(undefined8 **)_t = local_4a0[0].d_ptr;
      }
      break;
    case 0x1a:
      if (*_a[1] == 0) {
        QVar4 = QMetaType::fromType<ReplacedParams>();
        **(undefined8 **)_t = QVar4.d_ptr;
      }
      else {
        memset(local_4b0,0,8);
        QMetaType::QMetaType(local_4b0);
        **(undefined8 **)_t = local_4b0[0].d_ptr;
      }
    }
  }
  else if (_c == IndexOfMethod) {
    puVar2 = (undefined4 *)*_a;
    pcVar3 = *_a[1];
    if (pcVar3 == search && (pcVar3 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *puVar2 = 0;
    }
    else {
      pcVar3 = *_a[1];
      if (pcVar3 == searchMore && (pcVar3 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *puVar2 = 1;
      }
      else {
        pcVar3 = *_a[1];
        if (pcVar3 == collect && (pcVar3 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
          *puVar2 = 2;
        }
        else {
          pcVar3 = *_a[1];
          if (pcVar3 == replace && (pcVar3 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
            *puVar2 = 3;
          }
          else {
            pcVar3 = *_a[1];
            if (pcVar3 == countFiles && (pcVar3 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0))
            {
              *puVar2 = 4;
            }
            else {
              pcVar3 = *_a[1];
              if (pcVar3 == canReplace && (pcVar3 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)
                 ) {
                *puVar2 = 5;
              }
              else {
                pcVar3 = *_a[1];
                if (pcVar3 == getListing &&
                    (pcVar3 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
                  *puVar2 = 6;
                }
                else {
                  pcVar3 = *_a[1];
                  if (pcVar3 == rename && (pcVar3 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)
                     ) {
                    *puVar2 = 7;
                  }
                  else {
                    pcVar3 = *_a[1];
                    if (pcVar3 == viewOptionsChanged &&
                        (pcVar3 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
                      *puVar2 = 8;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SessionWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<SessionWidget *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->search((*reinterpret_cast< std::add_pointer_t<SearchParams>>(_a[1]))); break;
        case 1: _t->searchMore((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->collect(); break;
        case 3: _t->replace((*reinterpret_cast< std::add_pointer_t<ReplaceParams>>(_a[1]))); break;
        case 4: _t->countFiles((*reinterpret_cast< std::add_pointer_t<CountFilesParams>>(_a[1]))); break;
        case 5: _t->canReplace((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->getListing((*reinterpret_cast< std::add_pointer_t<GetListingParams>>(_a[1]))); break;
        case 7: _t->rename((*reinterpret_cast< std::add_pointer_t<RenameParams>>(_a[1]))); break;
        case 8: _t->viewOptionsChanged((*reinterpret_cast< std::add_pointer_t<ViewOptions>>(_a[1]))); break;
        case 9: _t->onCanceled(); break;
        case 10: _t->onCountFiles(); break;
        case 11: _t->onGetListing(); break;
        case 12: _t->onFilesCounted(); break;
        case 13: _t->onRenamed((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 14: _t->onTabClose((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 15: _t->onCompleterActivated((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 16: _t->onListing((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[2]))); break;
        case 17: _t->on_results_currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 18: _t->onFound((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<SearchHits>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<SearchNameHits>>(_a[3]))); break;
        case 19: _t->onSearch(); break;
        case 20: _t->onPathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 21: _t->onPreview(); break;
        case 22: _t->onReplace(); break;
        case 23: _t->onPatternChanged((*reinterpret_cast< std::add_pointer_t<RegExp>>(_a[1]))); break;
        case 24: _t->onFilterChanged((*reinterpret_cast< std::add_pointer_t<RegExpPath>>(_a[1]))); break;
        case 25: _t->onReplacementChanged((*reinterpret_cast< std::add_pointer_t<RegExpReplacement>>(_a[1]))); break;
        case 26: _t->onReplaced((*reinterpret_cast< std::add_pointer_t<ReplacedParams>>(_a[1]))); break;
        case 27: _t->onCancel(); break;
        case 28: _t->on_open_textChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 29: _t->onCacheFileListClicked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< SearchParams >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< ReplaceParams >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< CountFilesParams >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< GetListingParams >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< RenameParams >(); break;
            }
            break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< ViewOptions >(); break;
            }
            break;
        case 18:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< SearchHits >(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< SearchNameHits >(); break;
            }
            break;
        case 23:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< RegExp >(); break;
            }
            break;
        case 24:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< RegExpPath >(); break;
            }
            break;
        case 25:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< RegExpReplacement >(); break;
            }
            break;
        case 26:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< ReplacedParams >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (SessionWidget::*)(SearchParams );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::search)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::searchMore)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::collect)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(ReplaceParams );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::replace)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(CountFilesParams );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::countFiles)) {
                *result = 4;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::canReplace)) {
                *result = 5;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(GetListingParams );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::getListing)) {
                *result = 6;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(RenameParams );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::rename)) {
                *result = 7;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(ViewOptions );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::viewOptionsChanged)) {
                *result = 8;
                return;
            }
        }
    }
}